

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O1

Aig_Man_t * Gia_ManToAigSimple(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  void *__s;
  Aig_Man_t *p_00;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  
  iVar1 = p->nObjs;
  sVar11 = (long)iVar1 << 3;
  __s = malloc(sVar11);
  memset(__s,0xff,sVar11);
  p_00 = Aig_ManStart(iVar1);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar5,pcVar2);
  }
  p_00->pName = pcVar5;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar5,pcVar2);
  }
  p_00->pSpec = pcVar5;
  p_00->nConstrs = p->nConstrs;
  uVar7 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar10 = 8;
    lVar12 = 0;
    uVar13 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)((long)pGVar3 + lVar10 + -8);
      uVar9 = (uint)uVar4;
      uVar8 = uVar4 & 0x1fffffff;
      if (uVar8 == 0x1fffffff || (int)uVar9 < 0) {
        if ((uVar9 & 0x9fffffff) == 0x9fffffff) {
          pAVar6 = Aig_ObjCreateCi(p_00);
        }
        else if ((int)uVar9 < 0 && (int)uVar8 != 0x1fffffff) {
          if ((long)(int)uVar7 <= (long)uVar13) goto LAB_006f6772;
          pAVar6 = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                        ((ulong)(uVar9 >> 0x1d & 1) ^
                                        *(ulong *)((long)__s +
                                                  ((long)((ulong)(uVar9 & 0x1fffffff) * -0x100000000
                                                         + lVar12) >> 0x1d))));
        }
        else {
          if ((~uVar4 & 0x1fffffff1fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAig.c"
                          ,0x188,"Aig_Man_t *Gia_ManToAigSimple(Gia_Man_t *)");
          }
          pAVar6 = (Aig_Obj_t *)((ulong)p_00->pConst1 ^ 1);
        }
      }
      else {
        if ((long)(int)uVar7 <= (long)uVar13) {
LAB_006f6772:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        pAVar6 = Aig_And(p_00,(Aig_Obj_t *)
                              ((ulong)((uint)(uVar4 >> 0x1d) & 1) ^
                              *(ulong *)((long)__s + ((long)(uVar8 * -0x100000000 + lVar12) >> 0x1d)
                                        )),
                         (Aig_Obj_t *)
                         ((ulong)((uint)(uVar4 >> 0x3d) & 1) ^
                         *(ulong *)((long)__s +
                                   ((long)((uVar4 >> 0x20 & 0x1fffffff) * -0x100000000 + lVar12) >>
                                   0x1d))));
      }
      *(Aig_Obj_t **)((long)__s + uVar13 * 8) = pAVar6;
      iVar1 = *(int *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x24);
      if (iVar1 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      *(uint *)(&pGVar3->field_0x0 + lVar10) = ((uint)pAVar6 & 1) + iVar1 * 2;
      if ((uVar13 != 0) && (uVar13 != (uint)pAVar6->Id)) {
        __assert_fail("i == 0 || Aig_ObjId(ppNodes[i]) == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAig.c"
                      ,0x18a,"Aig_Man_t *Gia_ManToAigSimple(Gia_Man_t *)");
      }
      uVar13 = uVar13 + 1;
      uVar7 = (ulong)p->nObjs;
      lVar12 = lVar12 + 0x100000000;
      lVar10 = lVar10 + 0xc;
    } while ((long)uVar13 < (long)uVar7);
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  if (__s != (void *)0x0) {
    free(__s);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Gia_ManToAigSimple( Gia_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t ** ppNodes;
    Gia_Obj_t * pObj;
    int i;
    ppNodes = ABC_FALLOC( Aig_Obj_t *, Gia_ManObjNum(p) );
    // create the new manager
    pNew = Aig_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create the PIs
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            ppNodes[i] = Aig_And( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)), Gia_ObjChild1Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
        else if ( Gia_ObjIsCi(pObj) )
            ppNodes[i] = Aig_ObjCreateCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            ppNodes[i] = Aig_ObjCreateCo( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
        else if ( Gia_ObjIsConst0(pObj) )
            ppNodes[i] = Aig_ManConst0(pNew);
        else
            assert( 0 );
        pObj->Value = Abc_Var2Lit( Aig_ObjId(Aig_Regular(ppNodes[i])), Aig_IsComplement(ppNodes[i]) );
        assert( i == 0 || Aig_ObjId(ppNodes[i]) == i );
    }
    Aig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( ppNodes );
    return pNew;
}